

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.hpp
# Opt level: O0

void __thiscall
vkt::tessellation::Image::Image
          (Image *this,DeviceInterface *vk,VkDevice device,Allocator *allocator,
          VkImageCreateInfo *imageCreateInfo,MemoryRequirement memoryRequirement)

{
  deUint64 dVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)9>_> data_00;
  Allocator *pAVar2;
  VkDevice pVVar3;
  VkResult result;
  Handle<(vk::HandleType)9> *pHVar4;
  Allocation *pAVar5;
  VkDeviceMemory VVar6;
  VkDeviceSize VVar7;
  VkImageCreateInfo *this_00;
  VkMemoryRequirements local_c0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_a8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_98;
  Move<vk::Handle<(vk::HandleType)9>_> local_78;
  RefData<vk::Handle<(vk::HandleType)9>_> local_58;
  VkImageCreateInfo *local_38;
  VkImageCreateInfo *imageCreateInfo_local;
  Allocator *allocator_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  Image *this_local;
  MemoryRequirement memoryRequirement_local;
  
  local_38 = imageCreateInfo;
  imageCreateInfo_local = (VkImageCreateInfo *)allocator;
  allocator_local = (Allocator *)device;
  device_local = (VkDevice)vk;
  vk_local = (DeviceInterface *)this;
  this_local._4_4_ = memoryRequirement.m_flags;
  ::vk::createImage(&local_78,vk,device,imageCreateInfo,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data_00.deleter.m_deviceIface = local_58.deleter.m_deviceIface;
  data_00.object.m_internal = local_58.object.m_internal;
  data_00.deleter.m_device = local_58.deleter.m_device;
  data_00.deleter.m_allocator = local_58.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique(&this->m_image,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_78);
  pVVar3 = device_local;
  pAVar2 = allocator_local;
  this_00 = imageCreateInfo_local;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)9>_> *)this);
  ::vk::getImageMemoryRequirements
            (&local_c0,(DeviceInterface *)pVVar3,(VkDevice)pAVar2,(VkImage)pHVar4->m_internal);
  (**(code **)(*(long *)this_00 + 0x18))(&local_a8,this_00,&local_c0,this_local._4_4_);
  local_98 = de::details::MovePtr::operator_cast_to_PtrData(&local_a8,(MovePtr *)this_00);
  data._8_8_ = local_58.deleter.m_deviceIface;
  data.ptr = (Allocation *)local_58.object.m_internal;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            (&this->m_allocation,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_a8);
  pVVar3 = device_local;
  pAVar2 = allocator_local;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)9>_> *)this);
  dVar1 = pHVar4->m_internal;
  pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_allocation).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar6 = ::vk::Allocation::getMemory(pAVar5);
  pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_allocation).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar7 = ::vk::Allocation::getOffset(pAVar5);
  result = (**(code **)(*(long *)pVVar3 + 0x68))(pVVar3,pAVar2,dVar1,VVar6.m_internal,VVar7);
  ::vk::checkResult(result,
                    "vk.bindImageMemory(device, *m_image, m_allocation->getMemory(), m_allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/tessellation/vktTessellationUtil.hpp"
                    ,0x56);
  return;
}

Assistant:

Image			(const vk::DeviceInterface&		vk,
														 const vk::VkDevice				device,
														 vk::Allocator&					allocator,
														 const vk::VkImageCreateInfo&	imageCreateInfo,
														 const vk::MemoryRequirement	memoryRequirement)

											: m_image		(createImage(vk, device, &imageCreateInfo))
											, m_allocation	(allocator.allocate(getImageMemoryRequirements(vk, device, *m_image), memoryRequirement))
										{
											VK_CHECK(vk.bindImageMemory(device, *m_image, m_allocation->getMemory(), m_allocation->getOffset()));
										}